

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

int htmlCtxtSetOptionsInternal(xmlParserCtxtPtr ctxt,int options,int keepMask)

{
  uint uVar1;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    uVar1 = 0xffffffff;
  }
  else {
    ctxt->options = options & 0x46929e5U | keepMask & ctxt->options;
    ctxt->keepBlanks = (options & 0x100U) >> 8 ^ 1;
    if ((options & 0x100U) != 0) {
      ctxt->sax->ignorableWhitespace = xmlSAX2IgnorableWhitespace;
    }
    if ((((uint)options >> 0x13 & 1) != 0) && (ctxt->dict != (xmlDictPtr)0x0)) {
      xmlDictSetLimit(ctxt->dict,0);
    }
    ctxt->dictNames = 0;
    ctxt->linenumbers = 1;
    uVar1 = options & 0xfb96d618;
  }
  return uVar1;
}

Assistant:

static int
htmlCtxtSetOptionsInternal(xmlParserCtxtPtr ctxt, int options, int keepMask)
{
    int allMask;

    if (ctxt == NULL)
        return(-1);

    allMask = HTML_PARSE_RECOVER |
              HTML_PARSE_HTML5 |
              HTML_PARSE_NODEFDTD |
              HTML_PARSE_NOERROR |
              HTML_PARSE_NOWARNING |
              HTML_PARSE_PEDANTIC |
              HTML_PARSE_NOBLANKS |
              HTML_PARSE_NONET |
              HTML_PARSE_NOIMPLIED |
              HTML_PARSE_COMPACT |
              HTML_PARSE_HUGE |
              HTML_PARSE_IGNORE_ENC |
              HTML_PARSE_BIG_LINES;

    ctxt->options = (ctxt->options & keepMask) | (options & allMask);

    /*
     * For some options, struct members are historically the source
     * of truth. See xmlCtxtSetOptionsInternal.
     */
    ctxt->keepBlanks = (options & HTML_PARSE_NOBLANKS) ? 0 : 1;

    /*
     * Changing SAX callbacks is a bad idea. This should be fixed.
     */
    if (options & HTML_PARSE_NOBLANKS) {
        ctxt->sax->ignorableWhitespace = xmlSAX2IgnorableWhitespace;
    }
    if (options & HTML_PARSE_HUGE) {
        if (ctxt->dict != NULL)
            xmlDictSetLimit(ctxt->dict, 0);
    }

    /*
     * It would be useful to allow this feature.
     */
    ctxt->dictNames = 0;

    ctxt->linenumbers = 1;

    /*
     * Allow XML_PARSE_NOENT which many users set on the HTML parser.
     */
    return(options & ~allMask & ~XML_PARSE_NOENT);
}